

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O2

void __thiscall OpenMD::DumpReader::readFrame(DumpReader *this,int whichFrame)

{
  uint uVar1;
  uint uVar2;
  SnapshotManager *pSVar3;
  Vector<double,_3U> *v;
  byte bVar4;
  bool bVar5;
  Vector<double,_3U> *this_00;
  Thermo thermo;
  Vector3d com;
  Vector3d comvel;
  Vector<double,_3U> local_50;
  Vector3d comw;
  
  if (this->isScanned_ == false) {
    scanFile(this);
  }
  pSVar3 = this->info_->sman_;
  uVar1 = pSVar3->atomStorageLayout_;
  uVar2 = pSVar3->rigidBodyStorageLayout_;
  bVar4 = (byte)uVar2 | (byte)uVar1;
  this->needPos_ = (bool)(bVar4 & 1);
  bVar5 = true;
  if ((uVar2 & 0x408) == 0 && (uVar1 & 0xc08) == 0) {
    bVar5 = (bool)((byte)(uVar2 >> 0xb) & 1);
  }
  this->needVel_ = (bool)(bVar4 >> 1 & 1);
  this->needQuaternion_ = bVar5;
  this->needAngMom_ = (bool)(bVar4 >> 4 & 1);
  this->readField_ = (bool)((byte)(uVar1 >> 0xc) & 1);
  readSet(this,whichFrame);
  if (this->needCOMprops_ == true) {
    thermo.info_ = this->info_;
    Vector<double,_3U>::Vector(&com.super_Vector<double,_3U>);
    if ((this->needPos_ == true) && (this->needVel_ == true)) {
      Vector<double,_3U>::Vector(&comvel.super_Vector<double,_3U>);
      this_00 = &comw.super_Vector<double,_3U>;
      Vector<double,_3U>::Vector(this_00);
      Thermo::getComAll(&thermo,&com,(Vector3d *)&comvel.super_Vector<double,_3U>);
      v = &local_50;
      Thermo::getAngularMomentum((Vector3d *)v,&thermo);
    }
    else {
      v = &comvel.super_Vector<double,_3U>;
      Thermo::getCom((Vector3d *)v,&thermo);
      this_00 = &com.super_Vector<double,_3U>;
    }
    Vector<double,_3U>::operator=(this_00,v);
  }
  return;
}

Assistant:

void DumpReader::readFrame(int whichFrame) {
    if (!isScanned_) scanFile();

    int asl  = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbsl = info_->getSnapshotManager()->getRigidBodyStorageLayout();

    needPos_ =
        (asl & DataStorage::dslPosition || rbsl & DataStorage::dslPosition) ?
            true :
            false;
    needVel_ =
        (asl & DataStorage::dslVelocity || rbsl & DataStorage::dslVelocity) ?
            true :
            false;
    needQuaternion_ =
        (asl & DataStorage::dslAmat || asl & DataStorage::dslDipole ||
         asl & DataStorage::dslQuadrupole || rbsl & DataStorage::dslAmat ||
         rbsl & DataStorage::dslDipole || rbsl & DataStorage::dslQuadrupole) ?
            true :
            false;
    needAngMom_ = (asl & DataStorage::dslAngularMomentum ||
                   rbsl & DataStorage::dslAngularMomentum) ?
                      true :
                      false;

    // some dump files contain the efield, but we should only parse
    // and set the field if we have actually allocated memory for it
    readField_ = (asl & DataStorage::dslElectricField) ? true : false;

    readSet(whichFrame);

    if (needCOMprops_) {
      Thermo thermo(info_);
      Vector3d com;

      if (needPos_ && needVel_) {
        Vector3d comvel;
        Vector3d comw;
        thermo.getComAll(com, comvel);
        comw = thermo.getAngularMomentum();
      } else {
        com = thermo.getCom();
      }
    }
  }